

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O0

void __thiscall minja::ExpressionNode::~ExpressionNode(ExpressionNode *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR_do_render_0041b630;
  std::shared_ptr<minja::Expression>::~shared_ptr((shared_ptr<minja::Expression> *)0x31c80a);
  TemplateNode::~TemplateNode((TemplateNode *)0x31c814);
  return;
}

Assistant:

ExpressionNode(const Location & loc, std::shared_ptr<Expression> && e) : TemplateNode(loc), expr(std::move(e)) {}